

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_35::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  size_t count;
  Type TVar1;
  _Base_ptr p_Var2;
  ArrayDisposer *in_RCX;
  Array<kj::ReadableDirectory::Entry> *result;
  StringPtr value;
  Fault local_80;
  ArrayBuilder<kj::ReadableDirectory::Entry> builder;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Array<char> local_38;
  
  kj::_::Mutex::lock(&(this->impl).mutex,SHARED);
  lock.ptr = &(this->impl).value;
  count = (this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
  lock.mutex = &(this->impl).mutex;
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ReadableDirectory::Entry>(count)
  ;
  builder.endPtr = builder.ptr + count;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  p_Var2 = *(_Base_ptr *)
            ((long)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  builder.pos = builder.ptr;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header)
    {
      __return_storage_ptr__->ptr = builder.ptr;
      __return_storage_ptr__->size_ = (long)builder.pos - (long)builder.ptr >> 5;
      __return_storage_ptr__->disposer = builder.disposer;
      builder.ptr = (Entry *)0x0;
      builder.pos = (RemoveConst<kj::ReadableDirectory::Entry> *)0x0;
      builder.endPtr = (Entry *)0x0;
      ArrayBuilder<kj::ReadableDirectory::Entry>::dispose(&builder);
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
      return __return_storage_ptr__;
    }
    TVar1 = *(int *)&p_Var2[2]._M_parent - DIRECTORY;
    if (SYMLINK < TVar1) break;
    value.content.size_ = (size_t)in_RCX;
    value.content.ptr = (char *)p_Var2[1]._M_parent;
    heapString((String *)&local_38,*(kj **)(p_Var2 + 1),value);
    (builder.pos)->type = TVar1;
    ((builder.pos)->name).content.ptr = local_38.ptr;
    ((builder.pos)->name).content.size_ = local_38.size_;
    ((builder.pos)->name).content.disposer = local_38.disposer;
    local_38.ptr = (char *)0x0;
    local_38.size_ = 0;
    builder.pos = builder.pos + 1;
    in_RCX = local_38.disposer;
    Array<char>::~Array(&local_38);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  kj::_::Debug::Fault::Fault
            (&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x3f5,FAILED,"e.second.node.is<DirectoryNode>()","");
  kj::_::Debug::Fault::fatal(&local_80);
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }